

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_flip_inplace(roaring_bitmap_t *x1,uint64_t range_start,uint64_t range_end)

{
  ushort uVar1;
  uint16_t *puVar2;
  rle16_t *prVar3;
  run_container_t *c;
  _Bool _Var4;
  uint uVar5;
  int iVar6;
  array_container_t *src;
  run_container_t *prVar7;
  uint8_t uVar8;
  uint8_t type;
  ushort uVar9;
  uint16_t lb_start;
  uint i;
  uint uVar10;
  uint64_t uVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  uint8_t local_4b;
  uint16_t local_4a;
  run_container_t *local_48;
  uint local_3c;
  ulong local_38;
  
  if (range_start < range_end) {
    uVar11 = 0;
    if (range_end < 0x100000000) {
      uVar11 = range_end;
    }
    uVar9 = (ushort)(range_start >> 0x10);
    uVar12 = uVar11 - 1;
    uVar13 = (uint)(uVar12 >> 0x10) & 0xffff;
    local_4a = (uint16_t)uVar12;
    lb_start = (uint16_t)range_start;
    if ((uint16_t)(uVar12 >> 0x10) == uVar9) {
      inplace_flip_container(&x1->high_low_container,uVar9,lb_start,local_4a);
      return;
    }
    if (lb_start != 0) {
      inplace_flip_container(&x1->high_low_container,uVar9,lb_start,0xffff);
      uVar9 = uVar9 + 1;
    }
    local_38 = uVar12 & 0xffff;
    uVar5 = uVar13 - (local_38 != 0xffff);
    local_3c = uVar13;
    if (uVar9 <= (ushort)uVar5) {
      uVar13 = (uint)uVar9;
      do {
        iVar6 = (x1->high_low_container).size;
        uVar9 = (ushort)uVar13;
        if (((long)iVar6 == 0) ||
           (puVar2 = (x1->high_low_container).keys, puVar2[(long)iVar6 + -1] == uVar9)) {
          i = iVar6 - 1;
LAB_00108b35:
          if ((int)i < 0) goto LAB_00108c80;
LAB_00108b3e:
          local_4b = (x1->high_low_container).typecodes[i & 0xffff];
          src = (array_container_t *)(x1->high_low_container).containers[i & 0xffff];
          if (local_4b == '\x04') {
            src = (array_container_t *)
                  shared_container_extract_copy((shared_container_t *)src,&local_4b);
          }
          local_48 = (run_container_t *)0x0;
          if (local_4b == '\x03') {
            iVar6 = run_container_negation_inplace((run_container_t *)src,&local_48);
            uVar8 = (uint8_t)iVar6;
            prVar7 = local_48;
            type = uVar8;
            if (uVar8 == '\x04') {
              uVar8 = *(uint8_t *)&local_48->runs;
              prVar7 = *(run_container_t **)local_48;
              type = '\x04';
            }
          }
          else if (local_4b == '\x02') {
            local_48 = (run_container_t *)bitset_container_create();
            array_container_negation(src,(bitset_container_t *)local_48);
            array_container_free(src);
            uVar8 = '\x01';
            prVar7 = local_48;
            type = uVar8;
          }
          else {
            _Var4 = bitset_container_negation_inplace((bitset_container_t *)src,&local_48);
            uVar8 = '\x02' - _Var4;
            prVar7 = local_48;
            type = uVar8;
          }
          c = local_48;
          if (uVar8 == '\x03') {
            iVar6 = run_container_cardinality(prVar7);
          }
          else {
            iVar6 = prVar7->n_runs;
          }
          if (iVar6 == 0) {
            container_free(c,type);
            ra_remove_at_index(&x1->high_low_container,i);
          }
          else {
            (x1->high_low_container).containers[i] = c;
            (x1->high_low_container).typecodes[i] = type;
          }
        }
        else {
          if (0 < iVar6) {
            iVar6 = iVar6 + -1;
            uVar10 = 0;
            do {
              i = iVar6 + uVar10 >> 1;
              uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar6 + uVar10 & 0xfffffffe));
              if (uVar1 < uVar9) {
                uVar10 = i + 1;
              }
              else {
                if (uVar1 <= uVar9) goto LAB_00108b3e;
                iVar6 = i - 1;
              }
            } while ((int)uVar10 <= iVar6);
            i = ~uVar10;
            goto LAB_00108b35;
          }
          i = 0xffffffff;
LAB_00108c80:
          prVar7 = run_container_create_given_capacity(1);
          if (prVar7 != (run_container_t *)0x0) {
            prVar3 = prVar7->runs;
            iVar6 = prVar7->n_runs;
            prVar3[iVar6].value = 0;
            prVar3[iVar6].length = 0xffff;
            prVar7->n_runs = prVar7->n_runs + 1;
          }
          ra_insert_new_key_value_at(&x1->high_low_container,~i,uVar9,prVar7,'\x03');
        }
        bVar14 = uVar13 != (uVar5 & 0xffff);
        uVar13 = uVar13 + 1;
      } while (bVar14);
    }
    if ((int)local_38 != 0xffff) {
      inplace_flip_container(&x1->high_low_container,(uint16_t)local_3c,0,local_4a);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_flip_inplace(roaring_bitmap_t *x1, uint64_t range_start,
                                 uint64_t range_end) {
    if (range_start >= range_end) {
        return;  // empty range
    }
    if (range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;
    uint16_t hb_end = (uint16_t)((range_end - 1) >> 16);
    const uint16_t lb_end = (uint16_t)(range_end - 1);

    if (hb_start == hb_end) {
        inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                               lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                                   0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            inplace_fully_flip_container(&x1->high_low_container, (uint16_t)hb);
        }
        // handle a partial final container
        if (lb_end != 0xFFFF) {
            inplace_flip_container(&x1->high_low_container, hb_end + 1, 0,
                                   lb_end);
            ++hb_end;
        }
    }
}